

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::BufferTestUtil::VertexArrayVerifier::VertexArrayVerifier
          (VertexArrayVerifier *this,Context *context)

{
  ShaderProgram **ppSVar1;
  RenderContext *renderCtx;
  int iVar2;
  deUint32 dVar3;
  ShaderProgram *pSVar4;
  undefined4 extraout_var;
  TestError *this_00;
  allocator<char> local_132;
  allocator<char> local_131;
  string local_130;
  string local_110;
  ProgramSources local_f0;
  
  BufferVerifierBase::BufferVerifierBase(&this->super_BufferVerifierBase,context);
  (this->super_BufferVerifierBase)._vptr_BufferVerifierBase =
       (_func_int **)&PTR__VertexArrayVerifier_01e23fd8;
  this->m_program = (ShaderProgram *)0x0;
  this->m_posLoc = 0;
  this->m_byteVecLoc = 0;
  pSVar4 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_BufferVerifierBase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,
             "attribute highp vec2 a_position;\nattribute mediump vec3 a_byteVec;\nvarying mediump vec3 v_byteVec;\nvoid main (void)\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n\tv_byteVec = a_byteVec;\n}\n"
             ,&local_131);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,
             "varying mediump vec3 v_byteVec;\nvoid main (void)\n{\n\tgl_FragColor = vec4(v_byteVec, 1.0);\n}\n"
             ,&local_132);
  glu::makeVtxFragSources(&local_f0,&local_110,&local_130);
  glu::ShaderProgram::ShaderProgram(pSVar4,renderCtx,&local_f0);
  ppSVar1 = &this->m_program;
  *ppSVar1 = pSVar4;
  glu::ProgramSources::~ProgramSources(&local_f0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  if (((*ppSVar1)->m_program).m_info.linkOk != false) {
    iVar2 = (*context->m_renderCtx->_vptr_RenderContext[3])();
    dVar3 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x780))
                      (((*ppSVar1)->m_program).m_program,"a_position");
    this->m_posLoc = dVar3;
    dVar3 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x780))
                      ((this->m_program->m_program).m_program,"a_byteVec");
    this->m_byteVecLoc = dVar3;
    return;
  }
  glu::operator<<(((this->super_BufferVerifierBase).m_context)->m_testCtx->m_log,*ppSVar1);
  pSVar4 = *ppSVar1;
  if (pSVar4 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar4);
  }
  operator_delete(pSVar4,0xd0);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fBufferTestUtil.cpp"
             ,0x12e);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

VertexArrayVerifier::VertexArrayVerifier (Context& context)
	: BufferVerifierBase	(context)
	, m_program				(DE_NULL)
	, m_posLoc				(0)
	, m_byteVecLoc			(0)
{
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(
		"attribute highp vec2 a_position;\n"
		"attribute mediump vec3 a_byteVec;\n"
		"varying mediump vec3 v_byteVec;\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = vec4(a_position, 0.0, 1.0);\n"
		"	v_byteVec = a_byteVec;\n"
		"}\n",

		"varying mediump vec3 v_byteVec;\n"
		"void main (void)\n"
		"{\n"
		"	gl_FragColor = vec4(v_byteVec, 1.0);\n"
		"}\n"));

	if (!m_program->isOk())
	{
		m_context.getTestContext().getLog() << *m_program;
		delete m_program;
		TCU_FAIL("Compile failed");
	}

	const glw::Functions& funcs = context.getRenderContext().getFunctions();
	m_posLoc		= funcs.getAttribLocation(m_program->getProgram(), "a_position");
	m_byteVecLoc	= funcs.getAttribLocation(m_program->getProgram(), "a_byteVec");
}